

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

string * nonius::detail::escape
                   (string *__return_storage_ptr__,string *source,
                   unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *escapes)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  const_iterator cVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  string magic;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  long local_40;
  char local_38 [16];
  
  local_48._M_current = local_38;
  local_40 = 0;
  local_38[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_48);
  std::
  transform<std::__detail::_Node_const_iterator<std::pair<char_const,std::__cxx11::string>,false,false>,std::back_insert_iterator<std::__cxx11::string>,nonius::detail::escape(std::__cxx11::string_const&,std::unordered_map<char,std::__cxx11::string,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::__cxx11::string>>>const&)::_lambda(std::pair<char_const,std::__cxx11::string>const&)_1_>
            ((escapes->_M_h)._M_before_begin._M_nxt,0,&local_48);
  __first._M_current = (source->_M_dataplus)._M_p;
  __last_00._M_current = __first._M_current + source->_M_string_length;
  std::
  __count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<nonius::detail::escape(std::__cxx11::string_const&,std::unordered_map<char,std::__cxx11::string,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::__cxx11::string>>>const&)::_lambda(char)_1_>>
            (__first,__last_00,
             (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2615:55)>
              )&local_48);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  while (__first._M_current != __last_00._M_current) {
    __last = std::
             find_first_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       (__first,__last_00,local_48,local_48._M_current + local_40);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::string>>
              (__first._M_current,__last._M_current,
               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__return_storage_ptr__);
    __first = __last;
    if (__last._M_current != __last_00._M_current) {
      cVar1 = std::
              _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&escapes->_M_h,__last._M_current);
      if (cVar1.
          super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      __first._M_current = __last._M_current + 1;
    }
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape(std::string const& source, std::unordered_map<char, std::string> const& escapes) {
            std::string magic;
            magic.reserve(escapes.size());
            std::transform(escapes.begin(), escapes.end(), std::back_inserter(magic), [](std::pair<char const, std::string> const& p) { return p.first; });

            auto first = source.begin();
            auto last = source.end();

            auto n_magic = std::count_if(first, last, [&magic](char c) { return magic.find(c) != std::string::npos; });

            std::string escaped;
            escaped.reserve(source.size() + n_magic*6);

            while(first != last) {
                auto next_magic = std::find_first_of(first, last, magic.begin(), magic.end());
                std::copy(first, next_magic, std::back_inserter(escaped));
                first = next_magic;
                if(first != last) {
                    auto it = escapes.find(*first);
                    if(it != escapes.end()) {
                        escaped += it->second;
                    }
                    ++first;
                }
            }
            return escaped;
        }